

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmMovemEaRg<(moira::Instr)77,(moira::Mode)10,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  StrWriter *this_00;
  char *pcVar6;
  char cVar7;
  Ea<(moira::Mode)10,_(moira::Size)4> src;
  Ea<(moira::Mode)10,_(moira::Size)4> local_3c;
  
  *addr = *addr + 2;
  iVar5 = (*this->_vptr_Moira[5])();
  Op<(moira::Mode)10,(moira::Size)4>(&local_3c,this,op & 7,addr);
  bVar4 = str->upper;
  pcVar6 = "movem";
  if ((bool)bVar4 != false) {
    pcVar6 = "MOVEM";
  }
  cVar7 = *pcVar6;
  if (cVar7 != '\0') {
    do {
      pcVar6 = pcVar6 + 1;
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar7;
      cVar7 = *pcVar6;
    } while (cVar7 != '\0');
    bVar4 = str->upper;
  }
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = '.';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (~bVar4 & 1) << 5 | 0x4c;
  iVar1 = (this->tab).raw;
  while (pcVar6 = str->ptr, pcVar6 < str->base + iVar1) {
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  this_00 = StrWriter::operator<<(str,&local_3c);
  pcVar6 = this_00->ptr;
  this_00->ptr = pcVar6 + 1;
  *pcVar6 = ',';
  pcVar6 = this_00->ptr;
  this_00->ptr = pcVar6 + 1;
  *pcVar6 = ' ';
  StrWriter::operator<<(this_00,(RegRegList)(u16)iVar5);
  return;
}

Assistant:

void
Moira::dasmMovemEaRg(StrWriter &str, u32 &addr, u16 op)
{
    auto dst = RegRegList ( dasmRead<Word>(addr)       );
    auto src = Op <M,S>   ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}